

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int https_write(HTTP_INFO *hi,char *buffer,int len)

{
  int local_2c;
  int local_28;
  int slen;
  int ret;
  int len_local;
  char *buffer_local;
  HTTP_INFO *hi_local;
  
  printf("11111111https_write %s \n",buffer);
  local_2c = 0;
  while( true ) {
    do {
      if ((hi->url).https == '\x01') {
        local_28 = mbedtls_ssl_write(&(hi->tls).ssl,(uchar *)(buffer + local_2c),
                                     (long)(len - local_2c));
      }
      else {
        local_28 = mbedtls_net_send(&(hi->tls).ssl_fd,(uchar *)(buffer + local_2c),
                                    (long)(len - local_2c));
      }
    } while (local_28 == -0x6880);
    if (local_28 < 1) break;
    local_2c = local_28 + local_2c;
    if (len <= local_2c) {
      return local_2c;
    }
  }
  return local_28;
}

Assistant:

static int https_write(HTTP_INFO *hi, char *buffer, int len)
{
    printf("11111111https_write %s \n", buffer);
    int ret, slen = 0;

    while(1)
    {
        if(hi->url.https == 1)
            ret = mbedtls_ssl_write(&hi->tls.ssl, (u_char *)&buffer[slen], (size_t)(len-slen));
        else
            ret = mbedtls_net_send(&hi->tls.ssl_fd, (u_char *)&buffer[slen], (size_t)(len-slen));

        if(ret == MBEDTLS_ERR_SSL_WANT_WRITE) continue;
        else if(ret <= 0) return ret;

        slen += ret;

        if(slen >= len) break;
    }

    return slen;
}